

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O0

void __thiscall QLCDNumber::display(QLCDNumber *this,int num)

{
  QLCDNumberPrivate *pQVar1;
  int in_ESI;
  long in_FS_OFFSET;
  QLCDNumberPrivate *unaff_retaddr;
  QLCDNumberPrivate *d;
  int in_stack_00000010;
  QString s;
  bool of;
  QString *s_00;
  
  s_00 = *(QString **)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QLCDNumber *)0x5badcd);
  pQVar1->val = (double)in_ESI;
  int2string(num,in_stack_00000010,d._4_4_,(bool *)unaff_retaddr);
  QLCDNumberPrivate::internalSetString(unaff_retaddr,s_00);
  QString::~QString((QString *)0x5bae67);
  if (*(QString **)(in_FS_OFFSET + 0x28) != s_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLCDNumber::display(int num)
{
    Q_D(QLCDNumber);
    d->val = (double)num;
    bool of;
    QString s = int2string(num, d->base, d->ndigits, &of);
    if (of)
        emit overflow();
    else
        d->internalSetString(s);
}